

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.hh
# Opt level: O2

string * phosg::Arguments::exc_prefix(string *__return_storage_ptr__,string *name)

{
  allocator<char> local_11;
  
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"(",&local_11);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,name);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,") ");
  return __return_storage_ptr__;
}

Assistant:

static inline std::string exc_prefix(const std::string& name) {
    std::string ret = "(";
    ret += name;
    ret += ") ";
    return ret;
  }